

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

void fast_forward_first_char2
               (compiler_common *common,PCRE2_UCHAR16 char1,PCRE2_UCHAR16 char2,sljit_s32 offset)

{
  int iVar1;
  sljit_compiler *psVar2;
  sljit_compiler *compiler;
  sljit_s32 value;
  uint uVar3;
  sljit_u8 *psVar4;
  jump_list *pjVar5;
  byte *pbVar6;
  sljit_jump *psVar7;
  sljit_label *psVar8;
  sljit_jump *psVar9;
  sljit_jump *psVar10;
  uint uVar11;
  sljit_sw sVar12;
  long lVar13;
  undefined4 local_64;
  undefined1 local_60;
  uint local_5c;
  sljit_jump *local_58;
  undefined4 local_4d;
  ulong local_48;
  long local_40;
  sljit_compiler *local_38;
  
  psVar2 = common->compiler;
  iVar1 = common->match_end_ptr;
  lVar13 = (long)iVar1;
  if ((lVar13 != 0) && (psVar2->error == 0)) {
    psVar2->mode32 = 0;
    psVar4 = emit_x86_instruction(psVar2,1,1,0,0x8e,lVar13);
    if (psVar4 != (sljit_u8 *)0x0) {
      *psVar4 = 0x8b;
    }
  }
  if (0 < offset) {
    sljit_emit_op2(psVar2,0x60,2,0,2,0,0x40,(ulong)(uint)(offset * 2));
  }
  if (iVar1 != 0) {
    if (psVar2->error == 0) {
      psVar2->mode32 = 0;
      psVar4 = emit_x86_instruction(psVar2,1,0xd,0,3,0);
      if (psVar4 != (sljit_u8 *)0x0) {
        *psVar4 = 0x89;
      }
    }
    sVar12 = 1;
    sljit_emit_op2(psVar2,0x60,1,0,1,0,0x40,(ulong)(offset * 2 + 2));
    if (psVar2->error == 0) {
      psVar2->mode32 = 0;
      sVar12 = 1;
      psVar4 = emit_x86_instruction(psVar2,1,0xd,0,1,0);
      if (psVar4 != (sljit_u8 *)0x0) {
        *psVar4 = ';';
      }
    }
    sljit_emit_cmov(psVar2,4,0xd,1,sVar12);
  }
  compiler = common->compiler;
  uVar11 = 0;
  if (char1 != char2) {
    uVar3 = (uint)(char2 ^ char1);
    uVar11 = 0;
    if ((uVar3 & uVar3 - 1) == 0) {
      uVar11 = uVar3;
    }
  }
  local_48 = (ulong)(uint)offset;
  local_58 = sljit_emit_cmp(compiler,3,2,0,0xd,0);
  if (common->mode == 1) {
    if (compiler->error == 0) {
      pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
    }
    else {
      pjVar5 = (jump_list *)0x0;
    }
    if (pjVar5 != (jump_list *)0x0) {
      pjVar5->next = common->failed_match;
      pjVar5->jump = local_58;
      common->failed_match = pjVar5;
    }
  }
  if (compiler->error == 0) {
    compiler->mode32 = 0;
    emit_mov(compiler,1,0,0x40,(long)((ulong)(uVar11 | char1) * 0x1000100000000) >> 0x20);
  }
  local_64 = 0xd06e0f66;
  sljit_emit_op_custom(compiler,&local_64,4);
  local_5c = uVar11;
  if (char1 == char2) {
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar4 = emit_x86_instruction(compiler,1,2,0,4,0);
      if (psVar4 != (sljit_u8 *)0x0) {
        *psVar4 = 0x89;
      }
    }
    local_64 = CONCAT22(0xd270,(undefined2)local_64);
    local_60 = 0;
  }
  else {
    if (compiler->error == 0) {
      if (uVar11 == 0) {
        uVar11 = (uint)char2;
      }
      compiler->mode32 = 0;
      emit_mov(compiler,1,0,0x40,(long)(int)(uVar11 * 0x10001));
    }
    local_64 = CONCAT13(0xd8,(undefined3)local_64);
    sljit_emit_op_custom(compiler,&local_64,4);
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar4 = emit_x86_instruction(compiler,1,2,0,4,0);
      if (psVar4 != (sljit_u8 *)0x0) {
        *psVar4 = 0x89;
      }
    }
    local_64 = CONCAT22(0xd270,(undefined2)local_64);
    local_60 = 0;
    sljit_emit_op_custom(compiler,&local_64,5);
    local_64 = CONCAT13(0xdb,(undefined3)local_64);
  }
  sljit_emit_op_custom(compiler,&local_64,5);
  if (compiler->error == 0) {
    compiler->mode32 = 0;
    psVar4 = emit_x86_instruction(compiler,0x11,0x40,-0x10,2,0);
    if (psVar4 != (sljit_u8 *)0x0) {
      psVar4[1] = psVar4[1] | 0x20;
    }
  }
  if (compiler->error == 0) {
    compiler->mode32 = 0;
    psVar4 = emit_x86_instruction(compiler,0x11,0x40,0xf,4,0);
    if (psVar4 != (sljit_u8 *)0x0) {
      psVar4[1] = psVar4[1] | 0x20;
    }
  }
  local_4d = 0x66f0f66;
  sljit_emit_op_custom(compiler,&local_4d,4);
  fast_forward_char_pair_sse2_compare(compiler,char1,char2,local_5c,0,2,3,1);
  local_64 = CONCAT22(0xc0d7,(undefined2)local_64);
  sljit_emit_op_custom(compiler,&local_64,4);
  sljit_emit_op2(compiler,0x60,2,0,2,0,4,0);
  if (compiler->error == 0) {
    compiler->mode32 = 0;
    pbVar6 = emit_x86_instruction(compiler,0x21,4,0,1,0);
    if (pbVar6 != (byte *)0x0) {
      *pbVar6 = *pbVar6 | 0x28;
    }
  }
  local_64 = CONCAT13(local_64._3_1_,0xc0bc0f);
  local_40 = lVar13;
  sljit_emit_op_custom(compiler,&local_64,3);
  psVar7 = sljit_emit_jump(compiler,1);
  if (compiler->error == 0) {
    compiler->mode32 = 0;
    psVar4 = emit_x86_instruction(compiler,1,2,0,4,0);
    if (psVar4 != (sljit_u8 *)0x0) {
      *psVar4 = '+';
    }
  }
  local_38 = psVar2;
  psVar8 = sljit_emit_label(compiler);
  sljit_emit_op2(compiler,0x60,2,0,2,0,0x40,0x10);
  psVar9 = sljit_emit_cmp(compiler,3,2,0,0xd,0);
  if (common->mode == 1) {
    if (compiler->error == 0) {
      pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
    }
    else {
      pjVar5 = (jump_list *)0x0;
    }
    if (pjVar5 != (jump_list *)0x0) {
      pjVar5->next = common->failed_match;
      pjVar5->jump = psVar9;
      common->failed_match = pjVar5;
    }
  }
  local_4d = 0x66f0f66;
  sljit_emit_op_custom(compiler,&local_4d,4);
  fast_forward_char_pair_sse2_compare(compiler,char1,char2,local_5c,0,2,3,1);
  local_64 = 0xc0d70f66;
  sljit_emit_op_custom(compiler,&local_64,4);
  local_64 = CONCAT13(local_64._3_1_,0xc0bc0f);
  sljit_emit_op_custom(compiler,&local_64,3);
  psVar10 = sljit_emit_jump(compiler,0);
  if ((psVar8 != (sljit_label *)0x0) && (psVar10 != (sljit_jump *)0x0)) {
    psVar10->flags = (psVar10->flags & 0xfffffffffffffffcU) + 1;
    (psVar10->u).label = psVar8;
  }
  psVar8 = sljit_emit_label(compiler);
  psVar2 = local_38;
  if ((psVar7 != (sljit_jump *)0x0) && (psVar8 != (sljit_label *)0x0)) {
    psVar7->flags = (psVar7->flags & 0xfffffffffffffffcU) + 1;
    (psVar7->u).label = psVar8;
  }
  sVar12 = 2;
  sljit_emit_op2(compiler,0x60,2,0,2,0,1,0);
  lVar13 = local_40;
  if (common->mode == 1) {
    pjVar5 = (jump_list *)0x0;
    psVar7 = sljit_emit_cmp(compiler,3,2,0,0xd,0);
    if (compiler->error == 0) {
      pjVar5 = (jump_list *)ensure_abuf(compiler,0x10);
    }
    if (pjVar5 != (jump_list *)0x0) {
      pjVar5->next = common->failed_match;
      pjVar5->jump = psVar7;
      common->failed_match = pjVar5;
    }
  }
  else {
    psVar8 = sljit_emit_label(compiler);
    if ((local_58 != (sljit_jump *)0x0) && (psVar8 != (sljit_label *)0x0)) {
      local_58->flags = (local_58->flags & 0xfffffffffffffffcU) + 1;
      (local_58->u).label = psVar8;
    }
    psVar8 = sljit_emit_label(compiler);
    if ((psVar9 != (sljit_jump *)0x0) && (psVar8 != (sljit_label *)0x0)) {
      psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
      (psVar9->u).label = psVar8;
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      sVar12 = 0xd;
      psVar4 = emit_x86_instruction(compiler,1,2,0,0xd,0);
      if (psVar4 != (sljit_u8 *)0x0) {
        *psVar4 = ';';
      }
    }
    sljit_emit_cmov(compiler,4,2,0xd,sVar12);
  }
  if (0 < (int)local_48) {
    sljit_emit_op2(psVar2,0x62,2,0,2,0,0x40,(ulong)(uint)((int)local_48 * 2));
  }
  if (((int)lVar13 != 0) && (psVar2->error == 0)) {
    psVar2->mode32 = 0;
    psVar4 = emit_x86_instruction(psVar2,1,3,0,0xd,0);
    if (psVar4 != (sljit_u8 *)0x0) {
      *psVar4 = 0x89;
    }
  }
  return;
}

Assistant:

static void fast_forward_first_char2(compiler_common *common, PCRE2_UCHAR char1, PCRE2_UCHAR char2, sljit_s32 offset)
{
DEFINE_COMPILER;
struct sljit_label *start;
struct sljit_jump *match;
struct sljit_jump *partial_quit;
PCRE2_UCHAR mask;
BOOL has_match_end = (common->match_end_ptr != 0);

SLJIT_ASSERT(common->mode == PCRE2_JIT_COMPLETE || offset == 0);

if (has_match_end)
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->match_end_ptr);

if (offset > 0)
  OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(offset));

if (has_match_end)
  {
  OP1(SLJIT_MOV, TMP3, 0, STR_END, 0);

  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, IN_UCHARS(offset + 1));
  OP2(SLJIT_SUB | SLJIT_SET_GREATER, SLJIT_UNUSED, 0, STR_END, 0, TMP1, 0);
  CMOV(SLJIT_GREATER, STR_END, TMP1, 0);
  }

#if (defined SLJIT_CONFIG_X86 && SLJIT_CONFIG_X86) && !(defined SUPPORT_VALGRIND)

/* SSE2 accelerated first character search. */

if (sljit_has_cpu_feature(SLJIT_HAS_SSE2))
  {
  fast_forward_first_char2_sse2(common, char1, char2, offset);

  if (offset > 0)
    OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(offset));

  if (has_match_end)
    OP1(SLJIT_MOV, STR_END, 0, TMP3, 0);
  return;
  }

#endif

start = LABEL();

partial_quit = CMP(SLJIT_GREATER_EQUAL, STR_PTR, 0, STR_END, 0);
if (common->mode == PCRE2_JIT_COMPLETE)
  add_jump(compiler, &common->failed_match, partial_quit);

OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

if (char1 == char2)
  CMPTO(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, char1, start);
else
  {
  mask = char1 ^ char2;
  if (is_powerof2(mask))
    {
    OP2(SLJIT_OR, TMP1, 0, TMP1, 0, SLJIT_IMM, mask);
    CMPTO(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, char1 | mask, start);
    }
  else
    {
    match = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_IMM, char1);
    CMPTO(SLJIT_NOT_EQUAL, TMP1, 0, SLJIT_IMM, char2, start);
    JUMPHERE(match);
    }
  }

#if defined SUPPORT_UNICODE && PCRE2_CODE_UNIT_WIDTH != 32
if (common->utf && offset > 0)
  {
  OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), IN_UCHARS(-(offset + 1)));
  jumpto_if_not_utf_char_start(compiler, TMP1, start);
  }
#endif

OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(offset + 1));

if (common->mode != PCRE2_JIT_COMPLETE)
  JUMPHERE(partial_quit);

if (has_match_end)
  OP1(SLJIT_MOV, STR_END, 0, TMP3, 0);
}